

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressLiterals
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,void *entropyWorkspace,
                 size_t entropyWorkspaceSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_strategy strategy,int disableLiteralCompression,int suspectUncompressible,
                 int bmi2)

{
  HUF_repeat HVar1;
  int iVar2;
  size_t sVar3;
  code *pcVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  HUF_repeat repeat;
  ZSTD_hufCTables_t *local_48;
  size_t local_40;
  void *local_38;
  
  local_40 = entropyWorkspaceSize;
  local_38 = entropyWorkspace;
  memcpy(nextHuf,prevHuf,0x810);
  if (disableLiteralCompression == 0) {
    local_48 = prevHuf;
    if ((int)strategy < 0) {
      __assert_fail("(int)strategy >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4a6c,"size_t ZSTD_minLiteralsToCompress(ZSTD_strategy, HUF_repeat)");
    }
    if (ZSTD_btultra2 < strategy) {
      __assert_fail("(int)strategy <= 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4a6d,"size_t ZSTD_minLiteralsToCompress(ZSTD_strategy, HUF_repeat)");
    }
    repeat = prevHuf->repeatMode;
    uVar7 = 3;
    if (9 - strategy < 3) {
      uVar7 = 9 - strategy;
    }
    uVar8 = 6;
    if (repeat != HUF_repeat_valid) {
      uVar8 = 8L << ((byte)uVar7 & 0x3f);
    }
    if (uVar8 <= srcSize) {
      uVar8 = ((ulong)(0x3ff < srcSize) - (ulong)(srcSize < 0x4000)) + 4;
      sVar3 = 0xffffffffffffffba;
      if (uVar8 <= dstCapacity && dstCapacity - uVar8 != 0) {
        bVar10 = repeat == HUF_repeat_valid;
        if (uVar8 == 3 && bVar10 || srcSize < 0x100) {
          pcVar4 = HUF_compress1X_repeat;
        }
        else {
          pcVar4 = HUF_compress4X_repeat;
        }
        uVar5 = (*pcVar4)((long)dst + uVar8,dstCapacity - uVar8,src,srcSize,0xff,0xb,local_38,
                          local_40,nextHuf,&repeat,
                          (ZSTD_btopt < strategy) * '\x02' +
                          (srcSize < 0x401 && strategy < ZSTD_lazy) * '\x04' +
                          (suspectUncompressible != 0) * '\b' | bmi2 != 0);
        HVar1 = repeat;
        uVar7 = 3 - (repeat == HUF_repeat_none);
        if (strategy == 0) {
          __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4646,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
        }
        bVar6 = 6;
        if (ZSTD_btopt < strategy) {
          bVar6 = (char)strategy - 1;
        }
        if ((uVar5 - 1 < 0xffffffffffffff88) &&
           (uVar5 < (srcSize - (srcSize >> (bVar6 & 0x3f))) - 2)) {
          if ((uVar5 == 1) &&
             ((7 < srcSize || (iVar2 = allBytesIdentical(src,srcSize), iVar2 != 0)))) {
            memcpy(nextHuf,local_48,0x810);
            sVar3 = ZSTD_compressRleLiteralsBlock(dst,dstCapacity,src,srcSize);
          }
          else {
            if (HVar1 == HUF_repeat_none) {
              nextHuf->repeatMode = HUF_repeat_check;
            }
            iVar9 = (int)srcSize;
            iVar2 = (int)uVar5;
            if (uVar8 == 5) {
              *(uint *)dst = iVar2 * 0x400000 + iVar9 * 0x10 | uVar7 | 0xc;
              *(char *)((long)dst + 4) = (char)(uVar5 >> 10);
            }
            else if (uVar8 == 4) {
              *(uint *)dst = iVar2 * 0x40000 + iVar9 * 0x10 | uVar7 | 8;
            }
            else {
              iVar2 = iVar2 * 0x4000 +
                      ((uVar7 | iVar9 * 0x10 + (uint)(uVar8 == 3 && bVar10 || srcSize < 0x100) * 4)
                      ^ 4);
              *(short *)dst = (short)iVar2;
              *(char *)((long)dst + 2) = (char)((uint)iVar2 >> 0x10);
            }
            sVar3 = uVar5 + uVar8;
          }
        }
        else {
          memcpy(nextHuf,prevHuf,0x810);
          sVar3 = ZSTD_noCompressLiterals(dst,dstCapacity,src,srcSize);
        }
      }
      return sVar3;
    }
  }
  sVar3 = ZSTD_noCompressLiterals(dst,dstCapacity,src,srcSize);
  return sVar3;
}

Assistant:

size_t ZSTD_compressLiterals (
                  void* dst, size_t dstCapacity,
            const void* src, size_t srcSize,
                  void* entropyWorkspace, size_t entropyWorkspaceSize,
            const ZSTD_hufCTables_t* prevHuf,
                  ZSTD_hufCTables_t* nextHuf,
                  ZSTD_strategy strategy,
                  int disableLiteralCompression,
                  int suspectUncompressible,
                  int bmi2)
{
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i, srcSize=%u, dstCapacity=%zu)",
                disableLiteralCompression, (U32)srcSize, dstCapacity);

    DEBUGLOG(6, "Completed literals listing (%zu bytes)", showHexa(src, srcSize));

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* if too small, don't even attempt compression (speed opt) */
    if (srcSize < ZSTD_minLiteralsToCompress(strategy, prevHuf->repeatMode))
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    RETURN_ERROR_IF(dstCapacity < lhSize+1, dstSize_tooSmall, "not enough space for compression");
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const flags = 0
            | (bmi2 ? HUF_flags_bmi2 : 0)
            | (strategy < ZSTD_lazy && srcSize <= 1024 ? HUF_flags_preferRepeat : 0)
            | (strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD ? HUF_flags_optimalDepth : 0)
            | (suspectUncompressible ? HUF_flags_suspectUncompressible : 0);

        typedef size_t (*huf_compress_f)(void*, size_t, const void*, size_t, unsigned, unsigned, void*, size_t, HUF_CElt*, HUF_repeat*, int);
        huf_compress_f huf_compress;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        huf_compress = singleStream ? HUF_compress1X_repeat : HUF_compress4X_repeat;
        cLitSize = huf_compress(ostart+lhSize, dstCapacity-lhSize,
                                src, srcSize,
                                HUF_SYMBOLVALUE_MAX, LitHufLog,
                                entropyWorkspace, entropyWorkspaceSize,
                                (HUF_CElt*)nextHuf->CTable,
                                &repeat, flags);
        DEBUGLOG(5, "%zu literals compressed into %zu bytes (before header)", srcSize, cLitSize);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            DEBUGLOG(5, "reusing statistics from previous huffman block");
            hType = set_repeat;
        }
    }

    {   size_t const minGain = ZSTD_minGain(srcSize, strategy);
        if ((cLitSize==0) || (cLitSize >= srcSize - minGain) || ERR_isError(cLitSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }   }
    if (cLitSize==1) {
        /* A return value of 1 signals that the alphabet consists of a single symbol.
         * However, in some rare circumstances, it could be the compressed size (a single byte).
         * For that outcome to have a chance to happen, it's necessary that `srcSize < 8`.
         * (it's also necessary to not generate statistics).
         * Therefore, in such a case, actively check that all bytes are identical. */
        if ((srcSize >= 8) || allBytesIdentical(src, srcSize)) {
            ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
            return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }   }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        if (!singleStream) assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + ((U32)(!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        assert(srcSize >= MIN_LITERALS_FOR_4_STREAMS);
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    DEBUGLOG(5, "Compressed literals: %u -> %u", (U32)srcSize, (U32)(lhSize+cLitSize));
    return lhSize+cLitSize;
}